

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtendAlign.h
# Opt level: O1

int __thiscall
ExtendAlign<DNA>::Extend
          (ExtendAlign<DNA> *this,Sequence<DNA> *A,Sequence<DNA> *B,size_t *bestA,size_t *bestB,
          Cigar *cigar,AlignmentDirection dir,size_t startA,size_t startB)

{
  size_t sVar1;
  int iVar2;
  pointer pCVar3;
  pointer pCVar4;
  pointer pcVar5;
  pointer pcVar6;
  pointer pCVar7;
  ulong uVar8;
  ulong uVar9;
  CigarOp CVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  size_t sVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  int iVar24;
  bool bVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  vector<CigarOp,_std::allocator<CigarOp>_> local_b8;
  ulong local_a0;
  Sequence<DNA> *local_98;
  Sequence<DNA> *local_90;
  size_t *local_88;
  ulong local_80;
  int local_78;
  int local_74;
  ulong local_70;
  ulong local_68;
  size_t *local_60;
  ulong local_58;
  size_t local_50;
  size_t local_48;
  ExtendAlign<DNA> *local_40;
  int local_38;
  allocator_type local_32;
  byte local_31;
  
  sVar15 = (B->sequence)._M_string_length - startB;
  uVar23 = (A->sequence)._M_string_length - startA;
  if (dir != Forward) {
    sVar15 = startB;
    uVar23 = startA;
  }
  local_80 = uVar23 + 1;
  local_98 = A;
  local_90 = B;
  local_88 = bestA;
  local_60 = bestB;
  local_40 = this;
  if ((ulong)((long)(this->mRow).
                    super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
              (long)(this->mRow).
                    super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) < local_80) {
    auVar26._8_4_ = (int)(local_80 >> 0x20);
    auVar26._0_8_ = local_80;
    auVar26._12_4_ = 0x45300000;
    dVar28 = ((auVar26._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_80) - 4503599627370496.0)) * 1.5;
    uVar8 = (ulong)dVar28;
    std::vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>::vector
              ((vector<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_> *)&local_b8,
               (long)(dVar28 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8,&local_32);
    pCVar3 = (this->mRow).
             super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (this->mRow).super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
                  super__Vector_impl_data._M_start;
    (this->mRow).super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    (this->mRow).super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pCVar3 != (pointer)0x0) {
      operator_delete(pCVar3);
    }
    if ((CigarEntry)
        local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
        super__Vector_impl_data._M_start != (CigarEntry)0x0) {
      operator_delete(local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  uVar8 = local_80;
  uVar9 = (sVar15 + 1) * local_80;
  if ((ulong)((long)(local_40->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage -
             (long)(local_40->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>.
                   _M_impl.super__Vector_impl_data._M_start) < uVar9) {
    auVar27._8_4_ = (int)(uVar9 >> 0x20);
    auVar27._0_8_ = uVar9;
    auVar27._12_4_ = 0x45300000;
    dVar28 = ((auVar27._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0)) * 1.5;
    uVar9 = (ulong)dVar28;
    std::vector<CigarOp,_std::allocator<CigarOp>_>::vector
              (&local_b8,(long)(dVar28 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f | uVar9,
               (allocator_type *)&local_32);
    pCVar4 = (local_40->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    (local_40->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
         super__Vector_impl_data._M_start;
    (local_40->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (local_40->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pCVar4 != (pointer)0x0) {
      operator_delete(pCVar4);
    }
    if ((CigarEntry)
        local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
        super__Vector_impl_data._M_start != (CigarEntry)0x0) {
      operator_delete(local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  if (local_88 != (size_t *)0x0) {
    *local_88 = startA;
  }
  if (local_60 != (size_t *)0x0) {
    *local_60 = startB;
  }
  pCVar3 = (local_40->mRow).
           super__Vector_base<ExtendAlign<DNA>::Cell,_std::allocator<ExtendAlign<DNA>::Cell>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pCVar3->score = 0;
  local_38 = (local_40->mAP).gapExtendScore;
  uVar11 = (local_40->mAP).gapOpenScore + local_38;
  local_70 = (ulong)uVar11;
  pCVar3->scoreGap = uVar11;
  uVar9 = 1;
  if (1 < uVar8) {
    iVar24 = (local_40->mAP).xDrop;
    pCVar4 = (local_40->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar20 = local_70;
    uVar22 = 1;
    do {
      iVar16 = (int)uVar20;
      uVar9 = uVar22;
      if (iVar16 < -iVar24) break;
      pCVar4[uVar22] = Insertion;
      pCVar3[uVar22].score = iVar16;
      pCVar3[uVar22].scoreGap = -0x40000000;
      uVar9 = uVar22 + 1;
      uVar20 = (ulong)(uint)(iVar16 + local_38);
      bVar25 = uVar22 != uVar23;
      uVar22 = uVar9;
    } while (bVar25);
  }
  if (sVar15 + 1 < 2) {
    local_58 = 0;
    local_50 = 0;
    iVar24 = 0;
    uVar23 = uVar8;
  }
  else {
    local_74 = (local_40->mAP).xDrop;
    pCVar4 = (local_40->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48 = 1;
    iVar24 = 0;
    local_50 = 0;
    local_58 = 0;
    uVar20 = 0;
    do {
      iVar16 = -0x40000000;
      uVar22 = uVar20;
      local_68 = uVar20;
      if (uVar20 < uVar9) {
        pcVar5 = (local_98->sequence)._M_dataplus._M_p;
        pcVar6 = (local_90->sequence)._M_dataplus._M_p;
        local_78 = (local_40->mAP).xDrop;
        uVar23 = (startB - 1) + local_48;
        if (dir != Forward) {
          uVar23 = startB - local_48;
        }
        pCVar7 = (local_40->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar14 = startA - uVar20;
        iVar17 = -0x40000000;
        iVar18 = -0x40000000;
        iVar16 = -0x40000000;
        do {
          iVar2 = pCVar3[uVar20].scoreGap;
          local_a0 = uVar9;
          if (uVar20 == 0) {
            uVar13 = 0;
            uVar21 = 0;
          }
          else {
            uVar13 = (startA - 1) + uVar20;
            if (dir != Forward) {
              uVar13 = uVar14;
            }
            if (((local_98->sequence)._M_string_length <= uVar13) ||
               ((local_90->sequence)._M_string_length <= uVar23)) {
              __assert_fail("index >= 0 && index < sequence.size()",
                            "/workspace/llm4binary/github/license_c_cmakelists/stevschmid[P]nsearch/libnsearch/include/nsearch/Sequence.h"
                            ,0x32,
                            "char Sequence<DNA>::operator[](const size_t) const [Alphabet = DNA]");
            }
            local_31 = '\0' < "\n  Metagenomics tool for the rest of us.\n\n  Usage:\n    nsearch search --query=<queryfile> --db=<databasefile>\n      --out=<outputfile> --min-identity=<minidentity> [--max-hits=<maxaccepts>] [--max-rejects=<maxrejects>] [--protein] [--strand=<strand>]\n    nsearch merge --forward=<forwardfile> --reverse=<reversefile> --out=<outputfile>\n    nsearch filter --in=<inputfile> --out=<outputfile> [--max-expected-errors=<maxee>]\n\n  Options:\n    --min-identity=<minidentity>    Minimum identity threshold (e.g. 0.8).\n    --max-hits=<maxaccepts>         Maximum number of successful hits reported for one query [default: 1].\n    --max-rejects=<maxrejects>      Abort after this many candidates were rejected [default: 16].\n    --max-expected-errors=<maxee>   Maximum number of expected errors [default: 1.0].\n    --strand=<strand>               Strand to search on (plus, minus or both). If minus (or both), queries are reverse complemented [default: both].\n"
                              [(long)pcVar6[uVar23] + (long)pcVar5[uVar13] * 0x1a + 0x1d5];
            iVar18 = iVar17 + "\n  Metagenomics tool for the rest of us.\n\n  Usage:\n    nsearch search --query=<queryfile> --db=<databasefile>\n      --out=<outputfile> --min-identity=<minidentity> [--max-hits=<maxaccepts>] [--max-rejects=<maxrejects>] [--protein] [--strand=<strand>]\n    nsearch merge --forward=<forwardfile> --reverse=<reversefile> --out=<outputfile>\n    nsearch filter --in=<inputfile> --out=<outputfile> [--max-expected-errors=<maxee>]\n\n  Options:\n    --min-identity=<minidentity>    Minimum identity threshold (e.g. 0.8).\n    --max-hits=<maxaccepts>         Maximum number of successful hits reported for one query [default: 1].\n    --max-rejects=<maxrejects>      Abort after this many candidates were rejected [default: 16].\n    --max-expected-errors=<maxee>   Maximum number of expected errors [default: 1.0].\n    --strand=<strand>               Strand to search on (plus, minus or both). If minus (or both), queries are reverse complemented [default: both].\n"
                              [(long)pcVar6[uVar23] + (long)pcVar5[uVar13] * 0x1a + 0x1d5];
            uVar21 = uVar23;
          }
          iVar19 = iVar18;
          if (iVar18 <= iVar16) {
            iVar19 = iVar16;
          }
          iVar18 = iVar19;
          if (iVar19 <= iVar2) {
            iVar18 = iVar2;
          }
          iVar17 = pCVar3[uVar20].score;
          if (local_78 < iVar24 - iVar18) {
            pCVar3[uVar20].score = -0x40000000;
            uVar22 = uVar22 + (uVar20 == uVar22);
          }
          else {
            if (iVar24 < iVar18) {
              if (local_88 != (size_t *)0x0) {
                *local_88 = uVar13;
              }
              local_50 = local_48;
              iVar24 = iVar18;
              local_58 = uVar20;
              if (local_60 != (size_t *)0x0) {
                *local_60 = uVar21;
              }
            }
            CVar10 = Insertion;
            if (((iVar18 != iVar16) && (CVar10 = Deletion, iVar2 < iVar19)) &&
               (CVar10 = Match, (local_31 & 1) == 0)) {
              CVar10 = Mismatch;
            }
            pCVar7[uVar20 + uVar8] = CVar10;
            pCVar3[uVar20].score = iVar18;
            iVar12 = uVar11 + iVar18;
            iVar19 = iVar12;
            if (iVar12 <= iVar2 + local_38) {
              iVar19 = iVar2 + local_38;
            }
            pCVar3[uVar20].scoreGap = iVar19;
            iVar16 = iVar16 + local_38;
            local_68 = uVar20;
            if (iVar16 < iVar12) {
              iVar16 = iVar12;
            }
          }
          uVar20 = uVar20 + 1;
          uVar14 = uVar14 - 1;
        } while (uVar9 != uVar20);
      }
      uVar20 = uVar9;
      if (uVar22 != uVar9) {
        if (local_68 < uVar9 - 1) {
          uVar20 = local_68 + 1;
        }
        else if ((iVar24 - local_74 <= iVar16) && (uVar9 < local_80)) {
          do {
            pCVar3[uVar20].score = iVar16;
            pCVar3[uVar20].scoreGap = uVar11 + iVar16;
            pCVar4[uVar20 + local_48 * local_80] = Insertion;
            iVar16 = iVar16 + local_38;
            uVar20 = uVar20 + 1;
            if (iVar16 < iVar24 - local_74) break;
          } while (uVar20 < local_80);
        }
        if (uVar20 < local_80) {
          pCVar3[uVar20].score = -0x40000000;
          pCVar3[uVar20].scoreGap = -0x40000000;
          uVar20 = uVar20 + 1;
        }
      }
      uVar23 = local_80;
      if (uVar22 == uVar9) break;
      sVar1 = local_48 + 1;
      uVar8 = uVar8 + local_80;
      bVar25 = local_48 != sVar15;
      uVar9 = uVar20;
      uVar20 = uVar22;
      local_48 = sVar1;
    } while (bVar25);
  }
  local_38 = iVar24;
  if (cigar != (Cigar *)0x0) {
    std::deque<CigarEntry,_std::allocator<CigarEntry>_>::clear
              (&cigar->super_deque<CigarEntry,_std::allocator<CigarEntry>_>);
    uVar8 = local_58;
    sVar15 = local_50;
LAB_00153670:
    if (uVar8 != 0 || sVar15 != 0) {
      CVar10 = (local_40->mOperations).super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl
               .super__Vector_impl_data._M_start[uVar8 + sVar15 * uVar23];
      local_b8.super__Vector_base<CigarOp,_std::allocator<CigarOp>_>._M_impl.super__Vector_impl_data
      ._M_start._0_5_ = CONCAT14(CVar10,1);
      Cigar::Add(cigar,(CigarEntry *)&local_b8);
      if (CVar10 < Insertion) {
        if (CVar10 == Match) {
LAB_001536e0:
          uVar8 = uVar8 - 1;
        }
        else if (CVar10 != Deletion) goto LAB_00153670;
        sVar15 = sVar15 - 1;
        goto LAB_00153670;
      }
      if (CVar10 == Mismatch) goto LAB_001536e0;
      if (CVar10 == Insertion) {
        uVar8 = uVar8 - 1;
      }
      goto LAB_00153670;
    }
    if (dir == Forward) {
      Cigar::Reverse(cigar);
    }
  }
  return local_38;
}

Assistant:

int Extend( const Sequence< Alphabet >& A, const Sequence< Alphabet >& B,
              size_t* bestA = NULL, size_t* bestB = NULL, Cigar* cigar = NULL,
              const AlignmentDirection dir = AlignmentDirection::Forward,
              size_t startA = 0, size_t startB = 0 ) {
    int    score;
    size_t x, y;
    size_t aIdx, bIdx;
    size_t bestX, bestY;

    size_t width, height;

    if( dir == AlignmentDirection::Forward ) {
      width  = A.Length() - startA + 1;
      height = B.Length() - startB + 1;
    } else {
      width  = startA + 1;
      height = startB + 1;
    }

    if( mRow.capacity() < width ) {
      // Enlarge vector
      mRow = Cells( width * 1.5 );
    }

    if( mOperations.capacity() < width * height ) {
      mOperations = CigarOps( width * height * 1.5 );
    }

    bestX = 0;
    bestY = 0;

    if( bestA )
      *bestA = startA;
    if( bestB )
      *bestB = startB;

    int bestScore      = 0;
    mRow[ 0 ].score    = 0;
    mRow[ 0 ].scoreGap = mAP.gapOpenScore + mAP.gapExtendScore;

    for( x = 1; x < width; x++ ) {
      score = mAP.gapOpenScore + x * mAP.gapExtendScore;

      if( score < -mAP.xDrop )
        break;

      mOperations[ x ]   = CigarOp::Insertion;
      mRow[ x ].score    = score;
      mRow[ x ].scoreGap = MinInt();
    }
    size_t rowSize = x;
    /* Print( mRow ); */

    size_t firstX = 0;

    for( y = 1; y < height; y++ ) {

      int rowGap    = MinInt();
      int score     = MinInt();
      int diagScore = MinInt();

      size_t lastX = firstX;

      for( x = firstX; x < rowSize; x++ ) {
        int colGap = mRow[ x ].scoreGap;

        aIdx = 0;
        bIdx = 0;
        bool match;
        if( x > 0 ) {
          // diagScore: score at col-1, row-1

          if( dir == AlignmentDirection::Forward ) {
            aIdx = startA + x - 1;
            bIdx = startB + y - 1;
          } else {
            aIdx = startA - x;
            bIdx = startB - y;
          }

          /* printf( "x:%zu y:%zu %c == %c\n", x, y, A[ aIdx ], B[ bIdx ] ); */
          match = MatchPolicy< Alphabet >::Match( A[ aIdx ], B[ bIdx ] );
          score = diagScore + ScorePolicy< Alphabet >::Score( A[ aIdx ], B[ bIdx ] );
        }

        // select highest score
        //  - coming from diag (current),
        //  - coming from left (row)
        //  - coming from top (col)
        if( score < rowGap )
          score = rowGap;
        if( score < colGap )
          score = colGap;

        // mRow[ x ] right now points to the previous row, so use this
        // in the next iteration for the diagonal computation of (x, y )
        diagScore = mRow[ x ].score;

        if( bestScore - score > mAP.xDrop ) {
          // X-Drop test failed
          mRow[ x ].score = MinInt();

          if( x == firstX ) {
            // Tighten left bound
            firstX++;
          }
        } else {
          lastX = x;

          // Check if we achieved new highscore
          if( score > bestScore ) {
            bestScore = score;

            if( bestA )
              *bestA = aIdx;
            if( bestB )
              *bestB = bIdx;

            bestX = x;
            bestY = y;
          }

          // Record new score
          CigarOp op;
          if( score == rowGap ) {
            op = CigarOp::Insertion;
          } else if( score == colGap ) {
            op = CigarOp::Deletion;
          } else {
            op = match ? CigarOp::Match : CigarOp::Mismatch;
          }
          mOperations[ y * width + x ] = op;

          mRow[ x ].score = score;
          mRow[ x ].scoreGap =
            std::max( score + mAP.gapOpenScore + mAP.gapExtendScore,
                      colGap + mAP.gapExtendScore );
          rowGap = std::max( score + mAP.gapOpenScore + mAP.gapExtendScore,
                             rowGap + mAP.gapExtendScore );
        }
      }

      if( firstX == rowSize ) {
        // All cells failed the X-Drop test
        // We are done 8)
        break;
      }

      if( lastX < rowSize - 1 ) {
        // Tighten right bound
        rowSize = lastX + 1;
      } else {
        // Extend row, since last checked column didn't fail X-Drop test
        while( rowGap >= ( bestScore - mAP.xDrop ) && rowSize < width ) {
          mRow[ rowSize ].score = rowGap;
          mRow[ rowSize ].scoreGap =
            rowGap + mAP.gapOpenScore + mAP.gapExtendScore;
          mOperations[ y * width + rowSize ] = CigarOp::Insertion;
          rowGap += mAP.gapExtendScore;
          rowSize++;
        }
      }

      // Properly reset right bound
      if( rowSize < width ) {
        mRow[ rowSize ].score    = MinInt();
        mRow[ rowSize ].scoreGap = MinInt();
        rowSize++;
      }
      /* Print( mRow ); */
    }

    if( cigar ) {
      size_t bx = bestX;
      size_t by = bestY;

      CigarEntry ce;
      cigar->Clear();
      while( bx != 0 || by != 0 ) {
        CigarOp op = mOperations[ by * width + bx ];
        cigar->Add( op );

        switch( op ) {
          case CigarOp::Insertion:
            bx--;
            break;
          case CigarOp::Deletion:
            by--;
            break;
          case CigarOp::Match:
            bx--;
            by--;
            break;
          case CigarOp::Mismatch:
            bx--;
            by--;
            break;
          default:
            assert( true );
            break;
        }
      }

      if( dir == AlignmentDirection::Forward ) {
        cigar->Reverse();
      }
    }

    return bestScore;
  }